

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::LeafPattern::LeafPattern(LeafPattern *this,string *name,value *v)

{
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR_flat_00166fc8;
  std::__cxx11::string::string((string *)&this->fName,(string *)name);
  value::value(&this->fValue,v);
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}